

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_x86.c
# Opt level: O3

int main(void)

{
  cs_mode mode;
  x86_reg xVar1;
  uint8_t *buffer;
  cs_detail *pcVar2;
  csh ud;
  cs_insn *pcVar3;
  size_t count;
  cs_err cVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  size_t sVar10;
  char *__format;
  uint post;
  long lVar11;
  bool bVar12;
  cs_insn *insn;
  cs_insn *local_60;
  cs_mode local_54;
  size_t local_50;
  cs_detail *local_48;
  long local_40;
  size_t local_38;
  
  lVar11 = 0;
  do {
    mode = (&DAT_0025cd44)[lVar11 * 10];
    cVar4 = cs_open(CS_ARCH_X86,mode,&handle);
    if (cVar4 == CS_ERR_OK) {
      local_54 = mode;
      local_40 = lVar11;
      if ((&DAT_0025cd60)[lVar11 * 10] != 0) {
        cs_option(handle,(&DAT_0025cd60)[lVar11 * 10],(ulong)(uint)(&DAT_0025cd64)[lVar11 * 10]);
      }
      cs_option(handle,CS_OPT_DETAIL,3);
      buffer = (&PTR_anon_var_dwarf_27_0025cd48)[lVar11 * 5];
      sVar10 = (&DAT_0025cd50)[lVar11 * 5];
      local_50 = cs_disasm(handle,buffer,sVar10,0x1000,0,&local_60);
      if (local_50 == 0) {
        puts("****************");
        printf("Platform: %s\n",(&PTR_anon_var_dwarf_45_0025cd58)[lVar11 * 5]);
        print_string_hex("Code:",buffer,sVar10);
        puts("ERROR: Failed to disasm given code!");
      }
      else {
        puts("****************");
        printf("Platform: %s\n",(&PTR_anon_var_dwarf_45_0025cd58)[lVar11 * 5]);
        print_string_hex("Code:",buffer,sVar10);
        puts("Disasm:");
        sVar10 = 0;
        do {
          printf("0x%lx:\t%s\t%s\n",local_60[sVar10].address,local_60[sVar10].mnemonic,
                 local_60[sVar10].op_str);
          pcVar3 = local_60;
          ud = handle;
          pcVar2 = local_60[sVar10].detail;
          if (pcVar2 != (cs_detail *)0x0) {
            print_string_hex("\tPrefix:",(uchar *)&pcVar2->field_6,4);
            print_string_hex("\tOpcode:",(pcVar2->field_6).x86.opcode,4);
            printf("\trex: 0x%x\n",(ulong)(pcVar2->field_6).x86.rex);
            printf("\taddr_size: %u\n",(ulong)(pcVar2->field_6).x86.addr_size);
            printf("\tmodrm: 0x%x\n",(ulong)(pcVar2->field_6).x86.modrm);
            printf("\tdisp: 0x%x\n",(ulong)(pcVar2->field_6).arm.cps_mode);
            if ((local_54 & CS_MODE_16) == CS_MODE_ARM) {
              printf("\tsib: 0x%x\n",(ulong)(pcVar2->field_6).x86.sib);
              xVar1 = (pcVar2->field_6).x86.sib_base;
              if (xVar1 != X86_REG_INVALID) {
                pcVar7 = cs_reg_name(handle,xVar1);
                printf("\t\tsib_base: %s\n",pcVar7);
              }
              xVar1 = (pcVar2->field_6).x86.sib_index;
              if (xVar1 != X86_REG_INVALID) {
                pcVar7 = cs_reg_name(handle,xVar1);
                printf("\t\tsib_index: %s\n",pcVar7);
              }
              if ((pcVar2->field_6).x86.sib_scale != '\0') {
                printf("\t\tsib_scale: %d\n");
              }
            }
            if ((pcVar2->field_6).x86.sse_cc != X86_SSE_CC_INVALID) {
              printf("\tsse_cc: %u\n");
            }
            if ((pcVar2->field_6).x86.avx_cc != X86_AVX_CC_INVALID) {
              printf("\tavx_cc: %u\n");
            }
            if ((pcVar2->field_6).x86.avx_sae == true) {
              printf("\tavx_sae: %u\n",1);
            }
            local_48 = pcVar2;
            local_38 = sVar10;
            if ((pcVar2->field_6).x86.avx_rm != X86_AVX_RM_INVALID) {
              printf("\tavx_rm: %u\n");
            }
            uVar5 = cs_op_count(ud,pcVar3 + sVar10,2);
            if ((uVar5 != 0) &&
               (printf("\timm_count: %u\n",(ulong)uVar5), pcVar2 = local_48, 0 < (int)uVar5)) {
              post = 1;
              do {
                iVar6 = cs_op_index(ud,pcVar3 + sVar10,2,post);
                printf("\t\timms[%u]: 0x%lx\n",(ulong)post,
                       *(undefined8 *)(pcVar2->groups + (long)iVar6 * 0x30 + 0x46));
                bVar12 = post != uVar5;
                post = post + 1;
              } while (bVar12);
            }
            pcVar2 = local_48;
            if (((local_48->field_6).x86.op_count != '\0') &&
               (printf("\top_count: %u\n"), (pcVar2->field_6).x86.op_count != '\0')) {
              pcVar7 = (char *)((long)&pcVar2->field_6 + 0x58);
              uVar9 = 0;
              do {
                switch(*(undefined4 *)(pcVar7 + -0x28)) {
                case 1:
                  pcVar8 = cs_reg_name(handle,*(uint *)(pcVar7 + -0x20));
                  __format = "\t\toperands[%u].type: REG = %s\n";
                  goto LAB_001446dc;
                case 2:
                  pcVar8 = *(char **)(pcVar7 + -0x20);
                  __format = "\t\toperands[%u].type: IMM = 0x%lx\n";
LAB_001446dc:
                  printf(__format,uVar9 & 0xffffffff,pcVar8);
                  break;
                case 3:
                  printf("\t\toperands[%u].type: MEM\n",uVar9 & 0xffffffff);
                  if (*(uint *)(pcVar7 + -0x20) != 0) {
                    pcVar8 = cs_reg_name(handle,*(uint *)(pcVar7 + -0x20));
                    printf("\t\t\toperands[%u].mem.segment: REG = %s\n",uVar9 & 0xffffffff,pcVar8);
                  }
                  if (*(uint *)(pcVar7 + -0x1c) != 0) {
                    pcVar8 = cs_reg_name(handle,*(uint *)(pcVar7 + -0x1c));
                    printf("\t\t\toperands[%u].mem.base: REG = %s\n",uVar9 & 0xffffffff,pcVar8);
                  }
                  if (*(uint *)(pcVar7 + -0x18) != 0) {
                    pcVar8 = cs_reg_name(handle,*(uint *)(pcVar7 + -0x18));
                    printf("\t\t\toperands[%u].mem.index: REG = %s\n",uVar9 & 0xffffffff,pcVar8);
                  }
                  if (*(int *)(pcVar7 + -0x14) != 1) {
                    printf("\t\t\toperands[%u].mem.scale: %u\n",uVar9 & 0xffffffff);
                  }
                  pcVar8 = *(char **)(pcVar7 + -0x10);
                  if (pcVar8 != (char *)0x0) {
                    __format = "\t\t\toperands[%u].mem.disp: 0x%lx\n";
                    goto LAB_001446dc;
                  }
                  break;
                case 4:
                  printf("\t\toperands[%u].type: FP = %f\n",*(undefined8 *)(pcVar7 + -0x20),
                         uVar9 & 0xffffffff);
                }
                if (*(int *)(pcVar7 + -4) != 0) {
                  printf("\t\toperands[%u].avx_bcast: %u\n",uVar9 & 0xffffffff);
                }
                if (*pcVar7 == '\x01') {
                  printf("\t\toperands[%u].avx_zero_opmask: TRUE\n",uVar9 & 0xffffffff);
                }
                printf("\t\toperands[%u].size: %u\n",uVar9 & 0xffffffff,(ulong)(byte)pcVar7[-8]);
                uVar9 = uVar9 + 1;
                pcVar7 = pcVar7 + 0x30;
              } while (uVar9 < (pcVar2->field_6).x86.op_count);
            }
            putchar(10);
            sVar10 = local_38;
          }
          count = local_50;
          sVar10 = sVar10 + 1;
        } while (sVar10 != local_50);
        printf("0x%lx:\n",(ulong)local_60[local_50 - 1].size + local_60[local_50 - 1].address);
        cs_free(local_60,count);
      }
      putchar(10);
      cs_close(&handle);
      lVar11 = local_40;
    }
    else {
      printf("Failed on cs_open() with error returned: %u\n",(ulong)cVar4);
    }
    lVar11 = lVar11 + 1;
    if (lVar11 == 4) {
      return 0;
    }
  } while( true );
}

Assistant:

int main()
{
	test();

	return 0;
}